

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utf8Wrap.c
# Opt level: O1

XUtf8FontStruct * XCreateUtf8FontStruct(Display *dpy,char *base_font_name_list)

{
  byte bVar1;
  int iVar2;
  XUtf8FontStruct *__ptr;
  char **ppcVar3;
  ushort **ppuVar4;
  char *pcVar5;
  ulong uVar6;
  XFontStruct **ppXVar7;
  int *piVar8;
  undefined8 *puVar9;
  int *piVar10;
  int j;
  uint uVar11;
  byte *pbVar12;
  long lVar13;
  size_t __size;
  XFontStruct *pXVar14;
  byte *pbVar15;
  byte *pbVar16;
  long lVar17;
  ulong uVar18;
  char *pcVar19;
  int cnt;
  int local_44;
  int *local_40;
  long local_38;
  
  __ptr = (XUtf8FontStruct *)malloc(0x38);
  if (__ptr == (XUtf8FontStruct *)0x0) {
    return (XUtf8FontStruct *)0x0;
  }
  iVar2 = 1;
  pcVar19 = base_font_name_list;
  do {
    if (*pcVar19 == ',') {
      iVar2 = iVar2 + 1;
    }
    else if (*pcVar19 == '\0') break;
    pcVar19 = pcVar19 + 1;
  } while( true );
  ppcVar3 = (char **)malloc((long)iVar2 << 3);
  __ptr->font_name_list = ppcVar3;
  if (*base_font_name_list == '\0') {
    uVar11 = 0;
  }
  else {
    uVar11 = 0;
    ppuVar4 = __ctype_b_loc();
    do {
      pcVar19 = base_font_name_list + -1;
      do {
        pcVar5 = pcVar19;
        pcVar19 = pcVar5 + 1;
      } while ((*(byte *)((long)*ppuVar4 + (ulong)(byte)pcVar5[1] * 2 + 1) & 0x20) != 0);
      lVar17 = 0;
      for (__size = 2; (pcVar5[__size - 1] != '\0' && (pcVar5[__size - 1] != ','));
          __size = __size + 1) {
        lVar17 = lVar17 + 1;
      }
      if (2 < (int)__size - 2U) {
        pcVar5 = (char *)malloc(__size);
        ppcVar3[(int)uVar11] = pcVar5;
        uVar6 = 0;
        if (__size != 2) {
          do {
            ppcVar3[(int)uVar11][uVar6] = pcVar19[uVar6];
            uVar6 = uVar6 + 1;
            lVar17 = lVar17 + -1;
          } while (lVar17 != 0);
          uVar6 = uVar6 & 0xffffffff;
        }
        ppcVar3[(int)uVar11][uVar6] = '\0';
        uVar11 = uVar11 + 1;
      }
      base_font_name_list = pcVar19 + ((__size - 1) - (ulong)(pcVar19[__size - 2] == '\0'));
    } while (*base_font_name_list != '\0');
  }
  if ((int)uVar11 < 1) {
    free(ppcVar3);
    __ptr->font_name_list = (char **)0x0;
    __ptr->nb_font = uVar11;
    free(__ptr);
    return (XUtf8FontStruct *)0x0;
  }
  __ptr->nb_font = uVar11;
  uVar6 = (ulong)uVar11;
  ppXVar7 = (XFontStruct **)malloc(uVar6 * 8);
  __ptr->fonts = ppXVar7;
  piVar8 = (int *)malloc(uVar6 * 8);
  __ptr->ranges = piVar8;
  __ptr->fid = 0;
  __ptr->ascent = 0;
  __ptr->descent = 0;
  ppcVar3 = __ptr->font_name_list;
  uVar18 = 0;
  do {
    puVar9 = (undefined8 *)XListFonts(dpy,ppcVar3[uVar18],1,&local_44);
    if (local_44 == 0) {
      pXVar14 = (XFontStruct *)0x0;
    }
    else {
      pXVar14 = (XFontStruct *)0x0;
      if (puVar9 != (undefined8 *)0x0) {
        free(ppcVar3[uVar18]);
        pcVar19 = strdup((char *)*puVar9);
        ppcVar3[uVar18] = pcVar19;
        pXVar14 = (XFontStruct *)XLoadQueryFont(dpy);
        XFreeFontNames(puVar9);
      }
    }
    __ptr->fonts[uVar18] = pXVar14;
    if (pXVar14 == (XFontStruct *)0x0) {
      free(ppcVar3[uVar18]);
      ppcVar3[uVar18] = (char *)0x0;
    }
    else {
      __ptr->fid = pXVar14->fid;
      if (__ptr->ascent < pXVar14->ascent) {
        __ptr->ascent = pXVar14->ascent;
      }
      if (__ptr->descent < pXVar14->descent) {
        __ptr->descent = pXVar14->descent;
      }
    }
    uVar18 = uVar18 + 1;
  } while (uVar6 != uVar18);
  ppcVar3 = __ptr->font_name_list;
  piVar8 = __ptr->ranges;
  piVar10 = (int *)malloc(uVar6 * 4);
  uVar18 = 0;
LAB_001fb57a:
  pbVar15 = (byte *)ppcVar3[uVar18];
  piVar10[uVar18] = -1;
  (piVar8 + uVar18 * 2)[0] = 0;
  (piVar8 + uVar18 * 2)[1] = 0xffff;
  if (pbVar15 == (byte *)0x0) {
LAB_001fb5eb:
    pbVar15 = (byte *)0x0;
  }
  else {
    pcVar19 = strstr((char *)pbVar15,"fontspecific");
    if (pcVar19 != (char *)0x0) {
      pbVar16 = pbVar15 + -1;
      do {
        pbVar15 = pbVar15 + 1;
        pbVar12 = pbVar16 + 1;
        pbVar16 = pbVar16 + 1;
      } while (*pbVar12 != 0x2d);
      do {
        bVar1 = *pbVar15;
        pbVar15 = pbVar15 + 1;
        pbVar16 = pbVar15;
      } while (bVar1 != 0x2d);
      do {
        pbVar12 = pbVar16;
        pbVar16 = pbVar12 + 1;
      } while (*pbVar12 != 0x2d);
      *pbVar12 = 0;
      iVar2 = encoding_number((char *)pbVar15);
      *pbVar12 = 0x2d;
      piVar10[uVar18] = iVar2;
      goto LAB_001fb5eb;
    }
  }
  if (pbVar15 != (byte *)0x0) {
    iVar2 = 0;
    do {
      while( true ) {
        pbVar16 = pbVar15 + 1;
        bVar1 = *pbVar15;
        pbVar15 = pbVar16;
        if (bVar1 == 0x2d) break;
        if (bVar1 == 0) goto LAB_001fb62c;
      }
      iVar2 = iVar2 + 1;
    } while (iVar2 != 0xd);
    iVar2 = encoding_number((char *)pbVar16);
    piVar10[uVar18] = iVar2;
    if (iVar2 == 0) {
      for (; *pbVar16 != 0; pbVar16 = pbVar16 + 1) {
        if (*pbVar16 == 0x2d) goto LAB_001fb664;
      }
    }
  }
  goto LAB_001fb62c;
LAB_001fb664:
  for (; *pbVar16 != 0; pbVar16 = pbVar16 + 1) {
    if (*pbVar16 == 0x5b) {
      piVar8[uVar18 * 2] = 0xffff;
      lVar17 = 0;
      do {
        piVar8[uVar18 * 2 + 1] = (int)lVar17;
        do {
          if ((*pbVar16 == 0) || (*pbVar16 == 0x5d)) goto LAB_001fb62c;
          pbVar15 = pbVar16 + 1;
          pbVar16 = pbVar15;
          while( true ) {
            uVar11 = *pbVar16 - 0x20;
            if (((uVar11 < 0x40) && ((0xa000000000000001U >> ((ulong)uVar11 & 0x3f) & 1) != 0)) ||
               (*pbVar16 == 0)) break;
            pbVar16 = pbVar16 + 1;
          }
          lVar17 = strtol((char *)pbVar15,(char **)0x0,0);
          iVar2 = (int)lVar17;
          if (iVar2 < piVar8[uVar18 * 2]) {
            piVar8[uVar18 * 2] = iVar2;
          }
        } while (iVar2 <= piVar8[uVar18 * 2 + 1]);
      } while( true );
    }
  }
LAB_001fb62c:
  if (piVar10[uVar18] < 0) {
    piVar10[uVar18] = 1;
  }
  uVar18 = uVar18 + 1;
  if (uVar18 == uVar6) {
    __ptr->encodings = piVar10;
    local_38 = (long)__ptr->nb_font;
    if (0 < local_38) {
      lVar17 = 0;
      local_40 = piVar8;
      do {
        if ((lVar17 != 0) && (ppcVar3[lVar17] != (char *)0x0)) {
          lVar13 = 0;
          do {
            if (((ppcVar3[lVar13] != (char *)0x0) && (piVar10[lVar13] == piVar10[lVar17])) &&
               ((piVar8[lVar13 * 2] == piVar8[lVar17 * 2] &&
                ((piVar8[lVar13 * 2 + 1] != 0 && (piVar8[lVar17 * 2 + 1] != 0)))))) {
              ppXVar7 = __ptr->fonts;
              XFreeFont(dpy,ppXVar7[lVar17]);
              free(ppcVar3[lVar17]);
              ppcVar3[lVar17] = (char *)0x0;
              ppXVar7[lVar17] = (XFontStruct *)0x0;
              piVar8 = local_40;
            }
            lVar13 = lVar13 + 1;
          } while (lVar17 != lVar13);
        }
        lVar17 = lVar17 + 1;
      } while (lVar17 != local_38);
      return __ptr;
    }
    return __ptr;
  }
  goto LAB_001fb57a;
}

Assistant:

XUtf8FontStruct *
XCreateUtf8FontStruct(Display    *dpy,
		      const char *base_font_name_list) {

  XUtf8FontStruct *font_set;

  font_set = (XUtf8FontStruct*)malloc(sizeof(XUtf8FontStruct));

  if (!font_set) {
    return NULL;
  }

  font_set->nb_font = get_font_list(base_font_name_list,
				    &font_set->font_name_list);

  if (font_set->nb_font < 1) {
    free(font_set);
    return NULL;
  }

  load_fonts(dpy, font_set);

  return font_set;
}